

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerPoll.cpp
# Opt level: O0

void __thiscall Liby::PollerPoll::removeChanel(PollerPoll *this,Channel *ch)

{
  int iVar1;
  Logger *this_00;
  reference pvVar2;
  bool bVar3;
  double __x;
  int fd;
  Channel *ch_local;
  PollerPoll *this_local;
  
  bVar3 = false;
  if (ch != (Channel *)0x0) {
    iVar1 = Channel::get_fd(ch);
    bVar3 = -1 < iVar1;
  }
  if (!bVar3) {
    __assert_fail("ch && ch->get_fd() >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerPoll.cpp"
                  ,0x34,"virtual void Liby::PollerPoll::removeChanel(Channel *)");
  }
  this_00 = Logger::getLogger();
  Logger::log(this_00,__x);
  iVar1 = Channel::get_fd(ch);
  Poller::setChannel(&this->super_Poller,iVar1,(Channel *)0x0);
  pvVar2 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[](&this->pollfds_,(long)iVar1);
  pvVar2->fd = -1;
  return;
}

Assistant:

void PollerPoll::removeChanel(Channel *ch) {
    assert(ch && ch->get_fd() >= 0);
    info("remove Channel %p", ch);
    int fd = ch->get_fd();
    setChannel(fd, nullptr);
    pollfds_[fd].fd = -1;
}